

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::Option::Option(Option *this,string *option_name,string *option_description,callback_t *callback
                   ,App *parent)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  anon_class_1_0_00000001 *__f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  undefined8 in_R8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000a8;
  OptionBase<CLI::Option> *in_stack_fffffffffffffe90;
  
  OptionBase<CLI::Option>::OptionBase(in_stack_fffffffffffffe90);
  __args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x28);
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x380e95);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x40);
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x380ec2);
  __f = (anon_class_1_0_00000001 *)(in_RDI + 0x58);
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x380eef);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x70);
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x380f1f);
  ::std::__cxx11::string::string(this_01);
  ::std::__cxx11::string::string(this_01);
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 200),
             in_RDX);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xe8);
  ::std::__cxx11::string::string(this_01);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x108);
  ::std::__cxx11::string::string(this_01);
  ::std::function<std::__cxx11::string()>::function<CLI::Option::type_name_::_lambda()_1_,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)this_01,__f);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)this_00);
  *(undefined4 *)(in_RDI + 0x168) = 1;
  *(undefined4 *)(in_RDI + 0x16c) = 1;
  *(undefined4 *)(in_RDI + 0x170) = 1;
  *(undefined4 *)(in_RDI + 0x174) = 1;
  *(undefined8 *)(in_RDI + 0x178) = 0;
  *(undefined8 *)(in_RDI + 0x180) = 0;
  *(undefined8 *)(in_RDI + 0x188) = 0;
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::vector
            ((vector<CLI::Validator,_std::allocator<CLI::Validator>_> *)0x381039);
  *(undefined8 *)(in_RDI + 0x1b0) = 0;
  *(undefined8 *)(in_RDI + 0x1b8) = 0;
  *(undefined8 *)(in_RDI + 0x1a0) = 0;
  *(undefined8 *)(in_RDI + 0x1a8) = 0;
  *(undefined8 *)(in_RDI + 400) = 0;
  *(undefined8 *)(in_RDI + 0x198) = 0;
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::set
            ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
             0x381072);
  *(undefined8 *)(in_RDI + 0x1e0) = 0;
  *(undefined8 *)(in_RDI + 0x1e8) = 0;
  *(undefined8 *)(in_RDI + 0x1d0) = 0;
  *(undefined8 *)(in_RDI + 0x1d8) = 0;
  *(undefined8 *)(in_RDI + 0x1c0) = 0;
  *(undefined8 *)(in_RDI + 0x1c8) = 0;
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::set
            ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
             0x3810ab);
  *(undefined8 *)(in_RDI + 0x1f0) = in_R8;
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)this_00,
             (function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)__args_2);
  *(undefined8 *)(in_RDI + 0x218) = 0;
  *(undefined8 *)(in_RDI + 0x220) = 0;
  *(undefined8 *)(in_RDI + 0x228) = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x381114);
  *(undefined8 *)(in_RDI + 0x230) = 0;
  *(undefined8 *)(in_RDI + 0x238) = 0;
  *(undefined8 *)(in_RDI + 0x240) = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x38114d);
  *(undefined1 *)(in_RDI + 0x248) = 0;
  *(undefined1 *)(in_RDI + 0x249) = 0;
  *(undefined1 *)(in_RDI + 0x24a) = 0;
  *(undefined1 *)(in_RDI + 0x24b) = 0;
  *(undefined1 *)(in_RDI + 0x24c) = 0;
  *(undefined1 *)(in_RDI + 0x24d) = 0;
  *(undefined1 *)(in_RDI + 0x24e) = 0;
  ::std::__cxx11::string::string(this_02,__str);
  CLI::detail::split_names(in_RSI);
  CLI::detail::get_names(in_stack_000000a8);
  ::std::
  tie<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__f,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,__args_2);
  ::std::
  tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&>
  ::operator=((tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)this_00,
              (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)__args_2);
  std::
  tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple((tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x381217);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  ::std::__cxx11::string::~string(this_00);
  return;
}

Assistant:

Option(std::string option_name, std::string option_description, callback_t callback, App *parent)
        : description_(std::move(option_description)), parent_(parent), callback_(std::move(callback)) {
        std::tie(snames_, lnames_, pname_) = detail::get_names(detail::split_names(option_name));
    }